

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O3

QDistanceFieldData * QDistanceFieldData::create(QSize *size)

{
  uint uVar1;
  uint uVar2;
  QDistanceFieldData *pQVar3;
  uchar *puVar4;
  
  pQVar3 = (QDistanceFieldData *)operator_new(0x20);
  pQVar3->data = (uchar *)0x0;
  pQVar3->super_QSharedData = (QAtomicInt)0x0;
  pQVar3->glyph = 0;
  pQVar3->width = 0;
  pQVar3->height = 0;
  pQVar3->nbytes = 0;
  uVar1 = (size->wd).m_i;
  uVar2 = (size->ht).m_i;
  if (-1 < (int)(uVar1 | uVar2)) {
    pQVar3->width = uVar1;
    pQVar3->height = uVar2;
    pQVar3->nbytes = uVar2 * uVar1;
    puVar4 = (uchar *)malloc((ulong)(uVar2 * uVar1));
    pQVar3->data = puVar4;
  }
  return pQVar3;
}

Assistant:

QDistanceFieldData *QDistanceFieldData::create(const QSize &size)
{
    QDistanceFieldData *data = new QDistanceFieldData;

    if (size.isValid()) {
        data->width = size.width();
        data->height = size.height();
        // pixel data stored as a 1-byte alpha value
        data->nbytes = data->width * data->height; // tightly packed
        data->data = (uchar *)malloc(data->nbytes);
    }

    return data;
}